

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O2

void cmListFileLexerAppend(cmListFileLexer *lexer,char *text,int length)

{
  int *piVar1;
  char *__src;
  int iVar2;
  char *__dest;
  int iVar3;
  int iVar4;
  
  iVar3 = (lexer->token).length;
  iVar4 = length + iVar3;
  __src = (lexer->token).text;
  if ((__src == (char *)0x0) || (lexer->size <= iVar4)) {
    iVar2 = length + iVar3 + 1;
    __dest = (char *)malloc((long)iVar2);
    if (__src != (char *)0x0) {
      memcpy(__dest,__src,(long)iVar3);
      free(__src);
      iVar3 = (lexer->token).length;
      iVar4 = length + iVar3;
    }
    memcpy(__dest + iVar3,text,(long)length);
    __dest[iVar4] = '\0';
    (lexer->token).text = __dest;
    (lexer->token).length = iVar4;
    lexer->size = iVar2;
  }
  else {
    strcpy(__src + iVar3,text);
    piVar1 = &(lexer->token).length;
    *piVar1 = *piVar1 + length;
  }
  return;
}

Assistant:

static void cmListFileLexerAppend(cmListFileLexer* lexer, const char* text,
                                  int length)
{
  char* temp;
  int newSize;

  /* If the appended text will fit in the buffer, do not reallocate.  */
  newSize = lexer->token.length + length + 1;
  if (lexer->token.text && newSize <= lexer->size) {
    strcpy(lexer->token.text + lexer->token.length, text);
    lexer->token.length += length;
    return;
  }

  /* We need to extend the buffer.  */
  temp = malloc(newSize);
  if (lexer->token.text) {
    memcpy(temp, lexer->token.text, lexer->token.length);
    free(lexer->token.text);
  }
  memcpy(temp + lexer->token.length, text, length);
  temp[lexer->token.length + length] = 0;
  lexer->token.text = temp;
  lexer->token.length += length;
  lexer->size = newSize;
}